

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_socket_(int domain,int type,int protocol)

{
  int iVar1;
  int r;
  int protocol_local;
  int type_local;
  int domain_local;
  
  type_local = socket(domain,type,protocol);
  if (type_local < 0) {
    if ((type & 0x80800U) == 0) {
      type_local = -1;
    }
    else {
      type_local = socket(domain,type & 0xfff7f7ff,protocol);
      if (type_local < 0) {
        type_local = -1;
      }
      else if (((type & 0x800U) == 0) ||
              (iVar1 = evutil_fast_socket_nonblocking(type_local), -1 < iVar1)) {
        if (((type & 0x80000U) != 0) &&
           (iVar1 = evutil_fast_socket_closeonexec(type_local), iVar1 < 0)) {
          evutil_closesocket(type_local);
          type_local = -1;
        }
      }
      else {
        evutil_closesocket(type_local);
        type_local = -1;
      }
    }
  }
  return type_local;
}

Assistant:

evutil_socket_t
evutil_socket_(int domain, int type, int protocol)
{
	evutil_socket_t r;
#if defined(SOCK_NONBLOCK) && defined(SOCK_CLOEXEC)
	r = socket(domain, type, protocol);
	if (r >= 0)
		return r;
	else if ((type & (SOCK_NONBLOCK|SOCK_CLOEXEC)) == 0)
		return -1;
#endif
#define SOCKET_TYPE_MASK (~(EVUTIL_SOCK_NONBLOCK|EVUTIL_SOCK_CLOEXEC))
	r = socket(domain, type & SOCKET_TYPE_MASK, protocol);
	if (r < 0)
		return -1;
	if (type & EVUTIL_SOCK_NONBLOCK) {
		if (evutil_fast_socket_nonblocking(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	if (type & EVUTIL_SOCK_CLOEXEC) {
		if (evutil_fast_socket_closeonexec(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	return r;
}